

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_write_dir_header(mtar_t *tar,char *name)

{
  size_t sVar1;
  undefined1 local_100 [8];
  mtar_header_t h;
  char *name_local;
  mtar_t *tar_local;
  
  h.linkname._92_8_ = name;
  sVar1 = strlen(name);
  if (sVar1 < 100) {
    memset(local_100,0,0xe0);
    strcpy((char *)&h.mtime,(char *)h.linkname._92_8_);
    h.size._4_4_ = 0x35;
    local_100._0_4_ = 0x1fd;
    tar_local._4_4_ = mtar_write_header(tar,(mtar_header_t *)local_100);
  }
  else {
    tar_local._4_4_ = -9;
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_write_dir_header(mtar_t *tar, const char *name) {
  mtar_header_t h;
  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;
  /* Build header */
  memset(&h, 0, sizeof(h));
  strcpy(h.name, name);
  h.type = MTAR_TDIR;
  h.mode = 0775;
  /* Write header */
  return mtar_write_header(tar, &h);
}